

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void iadst16x16_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar7;
  uint uVar8;
  undefined1 auVar5 [16];
  __m128i alVar6;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar30;
  uint uVar31;
  __m128i offset;
  undefined1 auVar29 [16];
  uint uVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  int iVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  undefined1 auVar39 [16];
  int iVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  int iVar51;
  uint uVar52;
  int iVar53;
  uint uVar54;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i alVar50;
  int iVar55;
  uint uVar56;
  int iVar57;
  int iVar59;
  int iVar60;
  undefined1 auVar58 [16];
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i alVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  
  auVar29 = ZEXT416((uint)bit);
  lVar2 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x168);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 600);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x180);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x240);
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x220);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1a0);
  iVar3 = 1 << ((char)bit - 1U & 0x1f);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar49 = pmulld(auVar48,(undefined1  [16])*in);
  alVar50[0]._0_4_ = auVar49._0_4_ + iVar3 >> auVar29;
  alVar50[0]._4_4_ = auVar49._4_4_ + iVar3 >> auVar29;
  alVar50[1]._0_4_ = auVar49._8_4_ + iVar3 >> auVar29;
  alVar50[1]._4_4_ = auVar49._12_4_ + iVar3 >> auVar29;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1e0);
  auVar49 = pmulld(auVar20,(undefined1  [16])*in);
  auVar58._0_4_ = iVar3 - auVar49._0_4_ >> auVar29;
  auVar58._4_4_ = iVar3 - auVar49._4_4_ >> auVar29;
  auVar58._8_4_ = iVar3 - auVar49._8_4_ >> auVar29;
  auVar58._12_4_ = iVar3 - auVar49._12_4_ >> auVar29;
  auVar71 = pmulld((undefined1  [16])alVar50,auVar19);
  auVar49 = pmulld(auVar58,auVar5);
  auVar72._0_4_ = auVar71._0_4_ + iVar3 + auVar49._0_4_ >> auVar29;
  auVar72._4_4_ = auVar71._4_4_ + iVar3 + auVar49._4_4_ >> auVar29;
  auVar72._8_4_ = auVar71._8_4_ + iVar3 + auVar49._8_4_ >> auVar29;
  auVar72._12_4_ = auVar71._12_4_ + iVar3 + auVar49._12_4_ >> auVar29;
  auVar5 = pmulld(auVar5,(undefined1  [16])alVar50);
  auVar49 = pmulld(auVar19,auVar58);
  alVar6[0]._0_4_ = (auVar5._0_4_ + iVar3) - auVar49._0_4_ >> auVar29;
  alVar6[0]._4_4_ = (auVar5._4_4_ + iVar3) - auVar49._4_4_ >> auVar29;
  alVar6[1]._0_4_ = (auVar5._8_4_ + iVar3) - auVar49._8_4_ >> auVar29;
  alVar6[1]._4_4_ = (auVar5._12_4_ + iVar3) - auVar49._12_4_ >> auVar29;
  auVar49 = pmulld((undefined1  [16])alVar50,auVar18);
  auVar5 = pmulld(auVar58,auVar17);
  auVar70._0_4_ = auVar49._0_4_ + iVar3 + auVar5._0_4_ >> auVar29;
  auVar70._4_4_ = auVar49._4_4_ + iVar3 + auVar5._4_4_ >> auVar29;
  auVar70._8_4_ = auVar49._8_4_ + iVar3 + auVar5._8_4_ >> auVar29;
  auVar70._12_4_ = auVar49._12_4_ + iVar3 + auVar5._12_4_ >> auVar29;
  auVar49 = pmulld((undefined1  [16])alVar50,auVar17);
  auVar5 = pmulld(auVar18,auVar58);
  auVar39._0_4_ = (auVar49._0_4_ + iVar3) - auVar5._0_4_ >> auVar29;
  auVar39._4_4_ = (auVar49._4_4_ + iVar3) - auVar5._4_4_ >> auVar29;
  auVar39._8_4_ = (auVar49._8_4_ + iVar3) - auVar5._8_4_ >> auVar29;
  auVar39._12_4_ = (auVar49._12_4_ + iVar3) - auVar5._12_4_ >> auVar29;
  auVar49 = pmulld(auVar72,auVar18);
  auVar5 = pmulld((undefined1  [16])alVar6,auVar17);
  alVar73[0]._0_4_ = auVar49._0_4_ + iVar3 + auVar5._0_4_ >> auVar29;
  alVar73[0]._4_4_ = auVar49._4_4_ + iVar3 + auVar5._4_4_ >> auVar29;
  alVar73[1]._0_4_ = auVar49._8_4_ + iVar3 + auVar5._8_4_ >> auVar29;
  alVar73[1]._4_4_ = auVar49._12_4_ + iVar3 + auVar5._12_4_ >> auVar29;
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar5 = pmulld(auVar17,auVar72);
  auVar17 = pmulld(auVar18,(undefined1  [16])alVar6);
  auVar71 = pmulld((undefined1  [16])alVar50,auVar49);
  auVar18 = pmulld(auVar58,auVar49);
  iVar33 = auVar71._0_4_ + iVar3;
  iVar34 = auVar71._4_4_ + iVar3;
  iVar35 = auVar71._8_4_ + iVar3;
  iVar36 = auVar71._12_4_ + iVar3;
  auVar71 = pmulld(auVar70,auVar49);
  auVar19 = pmulld(auVar39,auVar49);
  iVar62 = auVar71._0_4_ + iVar3;
  iVar64 = auVar71._4_4_ + iVar3;
  iVar66 = auVar71._8_4_ + iVar3;
  iVar68 = auVar71._12_4_ + iVar3;
  auVar71 = pmulld(auVar72,auVar49);
  auVar20 = pmulld((undefined1  [16])alVar6,auVar49);
  iVar57 = auVar71._0_4_ + iVar3;
  iVar59 = auVar71._4_4_ + iVar3;
  iVar60 = auVar71._8_4_ + iVar3;
  iVar61 = auVar71._12_4_ + iVar3;
  auVar71 = pmulld((undefined1  [16])alVar73,auVar49);
  iVar15 = auVar71._0_4_ + iVar3;
  iVar21 = auVar71._4_4_ + iVar3;
  iVar23 = auVar71._8_4_ + iVar3;
  iVar25 = auVar71._12_4_ + iVar3;
  auVar71._0_4_ = (auVar5._0_4_ + iVar3) - auVar17._0_4_ >> auVar29;
  auVar71._4_4_ = (auVar5._4_4_ + iVar3) - auVar17._4_4_ >> auVar29;
  auVar71._8_4_ = (auVar5._8_4_ + iVar3) - auVar17._8_4_ >> auVar29;
  auVar71._12_4_ = (auVar5._12_4_ + iVar3) - auVar17._12_4_ >> auVar29;
  auVar5 = pmulld(auVar49,auVar71);
  iVar3 = iVar33 + auVar18._0_4_ >> auVar29;
  iVar12 = iVar34 + auVar18._4_4_ >> auVar29;
  iVar13 = iVar35 + auVar18._8_4_ >> auVar29;
  iVar14 = iVar36 + auVar18._12_4_ >> auVar29;
  iVar33 = iVar33 - auVar18._0_4_ >> auVar29;
  iVar34 = iVar34 - auVar18._4_4_ >> auVar29;
  iVar35 = iVar35 - auVar18._8_4_ >> auVar29;
  iVar36 = iVar36 - auVar18._12_4_ >> auVar29;
  iVar37 = iVar62 + auVar19._0_4_ >> auVar29;
  iVar40 = iVar64 + auVar19._4_4_ >> auVar29;
  iVar42 = iVar66 + auVar19._8_4_ >> auVar29;
  iVar44 = iVar68 + auVar19._12_4_ >> auVar29;
  iVar63 = iVar62 - auVar19._0_4_ >> auVar29;
  iVar65 = iVar64 - auVar19._4_4_ >> auVar29;
  iVar67 = iVar66 - auVar19._8_4_ >> auVar29;
  iVar69 = iVar68 - auVar19._12_4_ >> auVar29;
  iVar74 = iVar57 + auVar20._0_4_ >> auVar29;
  iVar75 = iVar59 + auVar20._4_4_ >> auVar29;
  iVar76 = iVar60 + auVar20._8_4_ >> auVar29;
  iVar77 = iVar61 + auVar20._12_4_ >> auVar29;
  iVar57 = iVar57 - auVar20._0_4_ >> auVar29;
  iVar59 = iVar59 - auVar20._4_4_ >> auVar29;
  iVar60 = iVar60 - auVar20._8_4_ >> auVar29;
  iVar61 = iVar61 - auVar20._12_4_ >> auVar29;
  iVar62 = iVar15 + auVar5._0_4_ >> auVar29;
  iVar64 = iVar21 + auVar5._4_4_ >> auVar29;
  iVar66 = iVar23 + auVar5._8_4_ >> auVar29;
  iVar68 = iVar25 + auVar5._12_4_ >> auVar29;
  uVar16 = iVar15 - auVar5._0_4_ >> auVar29;
  uVar22 = iVar21 - auVar5._4_4_ >> auVar29;
  uVar24 = iVar23 - auVar5._8_4_ >> auVar29;
  uVar26 = iVar25 - auVar5._12_4_ >> auVar29;
  if (do_cols == 0) {
    iVar15 = 10;
    if (10 < bd) {
      iVar15 = bd;
    }
    iVar15 = 0x20 << ((byte)iVar15 & 0x1f);
    iVar21 = -iVar15;
    iVar15 = iVar15 + -1;
    iVar27 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar5 = ZEXT416((uint)out_shift);
    iVar46 = (int)alVar50[0] + iVar27 >> auVar5;
    iVar51 = alVar50[0]._4_4_ + iVar27 >> auVar5;
    iVar53 = (int)alVar50[1] + iVar27 >> auVar5;
    iVar55 = alVar50[1]._4_4_ + iVar27 >> auVar5;
    iVar23 = iVar27 - auVar72._0_4_ >> auVar5;
    iVar25 = iVar27 - auVar72._4_4_ >> auVar5;
    iVar10 = iVar27 - auVar72._8_4_ >> auVar5;
    iVar11 = iVar27 - auVar72._12_4_ >> auVar5;
    uVar47 = (uint)(iVar46 < iVar21) * iVar21 | (uint)(iVar46 >= iVar21) * iVar46;
    uVar52 = (uint)(iVar51 < iVar21) * iVar21 | (uint)(iVar51 >= iVar21) * iVar51;
    uVar54 = (uint)(iVar53 < iVar21) * iVar21 | (uint)(iVar53 >= iVar21) * iVar53;
    uVar56 = (uint)(iVar55 < iVar21) * iVar21 | (uint)(iVar55 >= iVar21) * iVar55;
    *(uint *)*out = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)*out + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(*out + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54;
    *(uint *)((long)*out + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    uVar47 = (uint)(iVar23 < iVar21) * iVar21 | (uint)(iVar23 >= iVar21) * iVar23;
    uVar52 = (uint)(iVar25 < iVar21) * iVar21 | (uint)(iVar25 >= iVar21) * iVar25;
    uVar54 = (uint)(iVar10 < iVar21) * iVar21 | (uint)(iVar10 >= iVar21) * iVar10;
    uVar56 = (uint)(iVar11 < iVar21) * iVar21 | (uint)(iVar11 >= iVar21) * iVar11;
    *(uint *)out[1] = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)out[1] + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(out[1] + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54
    ;
    *(uint *)((long)out[1] + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    iVar23 = (int)alVar73[0] + iVar27 >> auVar5;
    iVar25 = alVar73[0]._4_4_ + iVar27 >> auVar5;
    iVar10 = (int)alVar73[1] + iVar27 >> auVar5;
    iVar11 = alVar73[1]._4_4_ + iVar27 >> auVar5;
    uVar47 = (uint)(iVar23 < iVar21) * iVar21 | (uint)(iVar23 >= iVar21) * iVar23;
    uVar52 = (uint)(iVar25 < iVar21) * iVar21 | (uint)(iVar25 >= iVar21) * iVar25;
    uVar54 = (uint)(iVar10 < iVar21) * iVar21 | (uint)(iVar10 >= iVar21) * iVar10;
    uVar56 = (uint)(iVar11 < iVar21) * iVar21 | (uint)(iVar11 >= iVar21) * iVar11;
    *(uint *)out[2] = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)out[2] + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(out[2] + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54
    ;
    *(uint *)((long)out[2] + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    iVar23 = iVar27 - auVar70._0_4_ >> auVar5;
    iVar25 = iVar27 - auVar70._4_4_ >> auVar5;
    iVar10 = iVar27 - auVar70._8_4_ >> auVar5;
    iVar11 = iVar27 - auVar70._12_4_ >> auVar5;
    uVar47 = (uint)(iVar23 < iVar21) * iVar21 | (uint)(iVar23 >= iVar21) * iVar23;
    uVar52 = (uint)(iVar25 < iVar21) * iVar21 | (uint)(iVar25 >= iVar21) * iVar25;
    uVar54 = (uint)(iVar10 < iVar21) * iVar21 | (uint)(iVar10 >= iVar21) * iVar10;
    uVar56 = (uint)(iVar11 < iVar21) * iVar21 | (uint)(iVar11 >= iVar21) * iVar11;
    *(uint *)out[3] = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)out[3] + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(out[3] + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54
    ;
    *(uint *)((long)out[3] + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    iVar23 = iVar37 + iVar27 >> auVar5;
    iVar25 = iVar40 + iVar27 >> auVar5;
    iVar37 = iVar42 + iVar27 >> auVar5;
    iVar40 = iVar44 + iVar27 >> auVar5;
    uVar47 = (uint)(iVar23 < iVar21) * iVar21 | (uint)(iVar23 >= iVar21) * iVar23;
    uVar52 = (uint)(iVar25 < iVar21) * iVar21 | (uint)(iVar25 >= iVar21) * iVar25;
    uVar54 = (uint)(iVar37 < iVar21) * iVar21 | (uint)(iVar37 >= iVar21) * iVar37;
    uVar56 = (uint)(iVar40 < iVar21) * iVar21 | (uint)(iVar40 >= iVar21) * iVar40;
    *(uint *)out[4] = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)out[4] + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(out[4] + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54
    ;
    *(uint *)((long)out[4] + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    iVar23 = iVar27 - iVar62 >> auVar5;
    iVar25 = iVar27 - iVar64 >> auVar5;
    iVar37 = iVar27 - iVar66 >> auVar5;
    iVar40 = iVar27 - iVar68 >> auVar5;
    uVar47 = (uint)(iVar23 < iVar21) * iVar21 | (uint)(iVar23 >= iVar21) * iVar23;
    uVar52 = (uint)(iVar25 < iVar21) * iVar21 | (uint)(iVar25 >= iVar21) * iVar25;
    uVar54 = (uint)(iVar37 < iVar21) * iVar21 | (uint)(iVar37 >= iVar21) * iVar37;
    uVar56 = (uint)(iVar40 < iVar21) * iVar21 | (uint)(iVar40 >= iVar21) * iVar40;
    *(uint *)out[5] = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)out[5] + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(out[5] + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54
    ;
    *(uint *)((long)out[5] + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    iVar23 = iVar74 + iVar27 >> auVar5;
    iVar25 = iVar75 + iVar27 >> auVar5;
    iVar37 = iVar76 + iVar27 >> auVar5;
    iVar40 = iVar77 + iVar27 >> auVar5;
    uVar47 = (uint)(iVar23 < iVar21) * iVar21 | (uint)(iVar23 >= iVar21) * iVar23;
    uVar52 = (uint)(iVar25 < iVar21) * iVar21 | (uint)(iVar25 >= iVar21) * iVar25;
    uVar54 = (uint)(iVar37 < iVar21) * iVar21 | (uint)(iVar37 >= iVar21) * iVar37;
    uVar56 = (uint)(iVar40 < iVar21) * iVar21 | (uint)(iVar40 >= iVar21) * iVar40;
    *(uint *)out[6] = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)out[6] + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(out[6] + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54
    ;
    *(uint *)((long)out[6] + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    iVar3 = iVar27 - iVar3 >> auVar5;
    iVar12 = iVar27 - iVar12 >> auVar5;
    iVar13 = iVar27 - iVar13 >> auVar5;
    iVar14 = iVar27 - iVar14 >> auVar5;
    uVar47 = (uint)(iVar3 < iVar21) * iVar21 | (uint)(iVar3 >= iVar21) * iVar3;
    uVar52 = (uint)(iVar12 < iVar21) * iVar21 | (uint)(iVar12 >= iVar21) * iVar12;
    uVar54 = (uint)(iVar13 < iVar21) * iVar21 | (uint)(iVar13 >= iVar21) * iVar13;
    uVar56 = (uint)(iVar14 < iVar21) * iVar21 | (uint)(iVar14 >= iVar21) * iVar14;
    *(uint *)out[7] = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)out[7] + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(out[7] + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54
    ;
    *(uint *)((long)out[7] + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    iVar23 = iVar33 + iVar27 >> auVar5;
    iVar25 = iVar34 + iVar27 >> auVar5;
    iVar33 = iVar35 + iVar27 >> auVar5;
    iVar34 = iVar36 + iVar27 >> auVar5;
    iVar3 = iVar27 - iVar57 >> auVar5;
    iVar12 = iVar27 - iVar59 >> auVar5;
    iVar13 = iVar27 - iVar60 >> auVar5;
    iVar14 = iVar27 - iVar61 >> auVar5;
    uVar47 = (uint)(iVar23 < iVar21) * iVar21 | (uint)(iVar23 >= iVar21) * iVar23;
    uVar52 = (uint)(iVar25 < iVar21) * iVar21 | (uint)(iVar25 >= iVar21) * iVar25;
    uVar54 = (uint)(iVar33 < iVar21) * iVar21 | (uint)(iVar33 >= iVar21) * iVar33;
    uVar56 = (uint)(iVar34 < iVar21) * iVar21 | (uint)(iVar34 >= iVar21) * iVar34;
    *(uint *)out[8] = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)out[8] + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(out[8] + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54
    ;
    *(uint *)((long)out[8] + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    uVar47 = (uint)(iVar3 < iVar21) * iVar21 | (uint)(iVar3 >= iVar21) * iVar3;
    uVar52 = (uint)(iVar12 < iVar21) * iVar21 | (uint)(iVar12 >= iVar21) * iVar12;
    uVar54 = (uint)(iVar13 < iVar21) * iVar21 | (uint)(iVar13 >= iVar21) * iVar13;
    uVar56 = (uint)(iVar14 < iVar21) * iVar21 | (uint)(iVar14 >= iVar21) * iVar14;
    *(uint *)out[9] = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    *(uint *)((long)out[9] + 4) =
         (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    *(uint *)(out[9] + 1) = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54
    ;
    *(uint *)((long)out[9] + 0xc) =
         (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    iVar35 = (int)(uVar16 + iVar27) >> auVar5;
    iVar36 = (int)(uVar22 + iVar27) >> auVar5;
    iVar37 = (int)(uVar24 + iVar27) >> auVar5;
    iVar40 = (int)(uVar26 + iVar27) >> auVar5;
    iVar60 = iVar27 - iVar63 >> auVar5;
    iVar61 = iVar27 - iVar65 >> auVar5;
    iVar62 = iVar27 - iVar67 >> auVar5;
    iVar64 = iVar27 - iVar69 >> auVar5;
    iVar23 = (int)(auVar39._0_4_ + iVar27) >> auVar5;
    iVar25 = (int)(auVar39._4_4_ + iVar27) >> auVar5;
    iVar33 = (int)(auVar39._8_4_ + iVar27) >> auVar5;
    iVar34 = (int)(auVar39._12_4_ + iVar27) >> auVar5;
    iVar66 = iVar27 - auVar71._0_4_ >> auVar5;
    iVar68 = iVar27 - auVar71._4_4_ >> auVar5;
    iVar63 = iVar27 - auVar71._8_4_ >> auVar5;
    iVar65 = iVar27 - auVar71._12_4_ >> auVar5;
    iVar3 = (int)((uint)alVar6[0] + iVar27) >> auVar5;
    iVar12 = (int)(alVar6[0]._4_4_ + iVar27) >> auVar5;
    iVar13 = (int)((uint)alVar6[1] + iVar27) >> auVar5;
    iVar14 = (int)(alVar6[1]._4_4_ + iVar27) >> auVar5;
    iVar42 = iVar27 - auVar58._0_4_ >> auVar5;
    iVar44 = iVar27 - auVar58._4_4_ >> auVar5;
    iVar57 = iVar27 - auVar58._8_4_ >> auVar5;
    iVar59 = iVar27 - auVar58._12_4_ >> auVar5;
    uVar16 = (uint)(iVar35 < iVar21) * iVar21 | (uint)(iVar35 >= iVar21) * iVar35;
    uVar22 = (uint)(iVar36 < iVar21) * iVar21 | (uint)(iVar36 >= iVar21) * iVar36;
    uVar24 = (uint)(iVar37 < iVar21) * iVar21 | (uint)(iVar37 >= iVar21) * iVar37;
    uVar26 = (uint)(iVar40 < iVar21) * iVar21 | (uint)(iVar40 >= iVar21) * iVar40;
    uVar47 = (uint)(iVar60 < iVar21) * iVar21 | (uint)(iVar60 >= iVar21) * iVar60;
    uVar52 = (uint)(iVar61 < iVar21) * iVar21 | (uint)(iVar61 >= iVar21) * iVar61;
    uVar54 = (uint)(iVar62 < iVar21) * iVar21 | (uint)(iVar62 >= iVar21) * iVar62;
    uVar56 = (uint)(iVar64 < iVar21) * iVar21 | (uint)(iVar64 >= iVar21) * iVar64;
    auVar39._0_4_ = (uint)(iVar23 < iVar21) * iVar21 | (uint)(iVar23 >= iVar21) * iVar23;
    auVar39._4_4_ = (uint)(iVar25 < iVar21) * iVar21 | (uint)(iVar25 >= iVar21) * iVar25;
    auVar39._8_4_ = (uint)(iVar33 < iVar21) * iVar21 | (uint)(iVar33 >= iVar21) * iVar33;
    auVar39._12_4_ = (uint)(iVar34 < iVar21) * iVar21 | (uint)(iVar34 >= iVar21) * iVar34;
    uVar38 = (uint)(iVar66 < iVar21) * iVar21 | (uint)(iVar66 >= iVar21) * iVar66;
    uVar41 = (uint)(iVar68 < iVar21) * iVar21 | (uint)(iVar68 >= iVar21) * iVar68;
    uVar43 = (uint)(iVar63 < iVar21) * iVar21 | (uint)(iVar63 >= iVar21) * iVar63;
    uVar45 = (uint)(iVar65 < iVar21) * iVar21 | (uint)(iVar65 >= iVar21) * iVar65;
    uVar4 = (uint)(iVar3 < iVar21) * iVar21 | (uint)(iVar3 >= iVar21) * iVar3;
    uVar7 = (uint)(iVar12 < iVar21) * iVar21 | (uint)(iVar12 >= iVar21) * iVar12;
    uVar8 = (uint)(iVar13 < iVar21) * iVar21 | (uint)(iVar13 >= iVar21) * iVar13;
    uVar9 = (uint)(iVar14 < iVar21) * iVar21 | (uint)(iVar14 >= iVar21) * iVar14;
    uVar28 = (uint)(iVar42 < iVar21) * iVar21 | (uint)(iVar42 >= iVar21) * iVar42;
    uVar30 = (uint)(iVar44 < iVar21) * iVar21 | (uint)(iVar44 >= iVar21) * iVar44;
    uVar31 = (uint)(iVar57 < iVar21) * iVar21 | (uint)(iVar57 >= iVar21) * iVar57;
    uVar32 = (uint)(iVar59 < iVar21) * iVar21 | (uint)(iVar59 >= iVar21) * iVar59;
    uVar16 = (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
    uVar22 = (uint)(iVar15 < (int)uVar22) * iVar15 | (iVar15 >= (int)uVar22) * uVar22;
    uVar24 = (uint)(iVar15 < (int)uVar24) * iVar15 | (iVar15 >= (int)uVar24) * uVar24;
    uVar26 = (uint)(iVar15 < (int)uVar26) * iVar15 | (iVar15 >= (int)uVar26) * uVar26;
    uVar47 = (uint)(iVar15 < (int)uVar47) * iVar15 | (iVar15 >= (int)uVar47) * uVar47;
    uVar52 = (uint)(iVar15 < (int)uVar52) * iVar15 | (iVar15 >= (int)uVar52) * uVar52;
    uVar54 = (uint)(iVar15 < (int)uVar54) * iVar15 | (iVar15 >= (int)uVar54) * uVar54;
    uVar56 = (uint)(iVar15 < (int)uVar56) * iVar15 | (iVar15 >= (int)uVar56) * uVar56;
    auVar39._0_4_ =
         (uint)(iVar15 < (int)auVar39._0_4_) * iVar15 |
         (iVar15 >= (int)auVar39._0_4_) * auVar39._0_4_;
    auVar39._4_4_ =
         (uint)(iVar15 < (int)auVar39._4_4_) * iVar15 |
         (iVar15 >= (int)auVar39._4_4_) * auVar39._4_4_;
    auVar39._8_4_ =
         (uint)(iVar15 < (int)auVar39._8_4_) * iVar15 |
         (iVar15 >= (int)auVar39._8_4_) * auVar39._8_4_;
    auVar39._12_4_ =
         (uint)(iVar15 < (int)auVar39._12_4_) * iVar15 |
         (iVar15 >= (int)auVar39._12_4_) * auVar39._12_4_;
    uVar38 = (uint)(iVar15 < (int)uVar38) * iVar15 | (iVar15 >= (int)uVar38) * uVar38;
    uVar41 = (uint)(iVar15 < (int)uVar41) * iVar15 | (iVar15 >= (int)uVar41) * uVar41;
    uVar43 = (uint)(iVar15 < (int)uVar43) * iVar15 | (iVar15 >= (int)uVar43) * uVar43;
    uVar45 = (uint)(iVar15 < (int)uVar45) * iVar15 | (iVar15 >= (int)uVar45) * uVar45;
    alVar6[0]._0_4_ = (uint)(iVar15 < (int)uVar4) * iVar15 | (iVar15 >= (int)uVar4) * uVar4;
    alVar6[0]._4_4_ = (uint)(iVar15 < (int)uVar7) * iVar15 | (iVar15 >= (int)uVar7) * uVar7;
    alVar6[1]._0_4_ = (uint)(iVar15 < (int)uVar8) * iVar15 | (iVar15 >= (int)uVar8) * uVar8;
    alVar6[1]._4_4_ = (uint)(iVar15 < (int)uVar9) * iVar15 | (iVar15 >= (int)uVar9) * uVar9;
    uVar4 = (uint)(iVar15 < (int)uVar28) * iVar15 | (iVar15 >= (int)uVar28) * uVar28;
    uVar7 = (uint)(iVar15 < (int)uVar30) * iVar15 | (iVar15 >= (int)uVar30) * uVar30;
    uVar8 = (uint)(iVar15 < (int)uVar31) * iVar15 | (iVar15 >= (int)uVar31) * uVar31;
    uVar9 = (uint)(iVar15 < (int)uVar32) * iVar15 | (iVar15 >= (int)uVar32) * uVar32;
  }
  else {
    *out = alVar50;
    *(int *)out[1] = -auVar72._0_4_;
    *(int *)((long)out[1] + 4) = -auVar72._4_4_;
    *(int *)(out[1] + 1) = -auVar72._8_4_;
    *(int *)((long)out[1] + 0xc) = -auVar72._12_4_;
    out[2] = alVar73;
    *(int *)out[3] = -auVar70._0_4_;
    *(int *)((long)out[3] + 4) = -auVar70._4_4_;
    *(int *)(out[3] + 1) = -auVar70._8_4_;
    *(int *)((long)out[3] + 0xc) = -auVar70._12_4_;
    *(int *)out[4] = iVar37;
    *(int *)((long)out[4] + 4) = iVar40;
    *(int *)(out[4] + 1) = iVar42;
    *(int *)((long)out[4] + 0xc) = iVar44;
    *(int *)out[5] = -iVar62;
    *(int *)((long)out[5] + 4) = -iVar64;
    *(int *)(out[5] + 1) = -iVar66;
    *(int *)((long)out[5] + 0xc) = -iVar68;
    *(int *)out[6] = iVar74;
    *(int *)((long)out[6] + 4) = iVar75;
    *(int *)(out[6] + 1) = iVar76;
    *(int *)((long)out[6] + 0xc) = iVar77;
    *(int *)out[7] = -iVar3;
    *(int *)((long)out[7] + 4) = -iVar12;
    *(int *)(out[7] + 1) = -iVar13;
    *(int *)((long)out[7] + 0xc) = -iVar14;
    *(int *)out[8] = iVar33;
    *(int *)((long)out[8] + 4) = iVar34;
    *(int *)(out[8] + 1) = iVar35;
    *(int *)((long)out[8] + 0xc) = iVar36;
    *(int *)out[9] = -iVar57;
    *(int *)((long)out[9] + 4) = -iVar59;
    *(int *)(out[9] + 1) = -iVar60;
    *(int *)((long)out[9] + 0xc) = -iVar61;
    uVar47 = -iVar63;
    uVar52 = -iVar65;
    uVar54 = -iVar67;
    uVar56 = -iVar69;
    uVar38 = -auVar71._0_4_;
    uVar41 = -auVar71._4_4_;
    uVar43 = -auVar71._8_4_;
    uVar45 = -auVar71._12_4_;
    uVar4 = -auVar58._0_4_;
    uVar7 = -auVar58._4_4_;
    uVar8 = -auVar58._8_4_;
    uVar9 = -auVar58._12_4_;
  }
  *(uint *)out[10] = uVar16;
  *(uint *)((long)out[10] + 4) = uVar22;
  *(uint *)(out[10] + 1) = uVar24;
  *(uint *)((long)out[10] + 0xc) = uVar26;
  *(uint *)out[0xb] = uVar47;
  *(uint *)((long)out[0xb] + 4) = uVar52;
  *(uint *)(out[0xb] + 1) = uVar54;
  *(uint *)((long)out[0xb] + 0xc) = uVar56;
  *(uint *)out[0xc] = auVar39._0_4_;
  *(uint *)((long)out[0xc] + 4) = auVar39._4_4_;
  *(uint *)(out[0xc] + 1) = auVar39._8_4_;
  *(uint *)((long)out[0xc] + 0xc) = auVar39._12_4_;
  *(uint *)out[0xd] = uVar38;
  *(uint *)((long)out[0xd] + 4) = uVar41;
  *(uint *)(out[0xd] + 1) = uVar43;
  *(uint *)((long)out[0xd] + 0xc) = uVar45;
  out[0xe] = alVar6;
  *(uint *)out[0xf] = uVar4;
  *(uint *)((long)out[0xf] + 4) = uVar7;
  *(uint *)(out[0xf] + 1) = uVar8;
  *(uint *)((long)out[0xf] + 0xc) = uVar9;
  return;
}

Assistant:

static void iadst16x16_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();
  __m128i v[16], x, y, temp1, temp2;
  // stage 0
  // stage 1
  // stage 2
  x = _mm_mullo_epi32(in[0], cospi62);
  v[0] = _mm_add_epi32(x, rnding);
  v[0] = _mm_srai_epi32(v[0], bit);

  x = _mm_mullo_epi32(in[0], cospi2);
  v[1] = _mm_sub_epi32(zero, x);
  v[1] = _mm_add_epi32(v[1], rnding);
  v[1] = _mm_srai_epi32(v[1], bit);

  // stage 3
  v[8] = v[0];
  v[9] = v[1];

  // stage 4
  temp1 = _mm_mullo_epi32(v[8], cospi8);
  x = _mm_mullo_epi32(v[9], cospi56);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[8], cospi56);
  x = _mm_mullo_epi32(v[9], cospi8);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[8] = temp1;
  v[9] = temp2;

  // stage 5
  v[4] = v[0];
  v[5] = v[1];
  v[12] = v[8];
  v[13] = v[9];

  // stage 6
  temp1 = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[4] = temp1;
  v[5] = temp2;

  temp1 = _mm_mullo_epi32(v[12], cospi16);
  x = _mm_mullo_epi32(v[13], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[12], cospi48);
  x = _mm_mullo_epi32(v[13], cospi16);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[12] = temp1;
  v[13] = temp2;

  // stage 7
  v[2] = v[0];
  v[3] = v[1];
  v[6] = v[4];
  v[7] = v[5];
  v[10] = v[8];
  v[11] = v[9];
  v[14] = v[12];
  v[15] = v[13];

  // stage 8
  y = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  v[2] = _mm_add_epi32(y, x);
  v[2] = _mm_add_epi32(v[2], rnding);
  v[2] = _mm_srai_epi32(v[2], bit);

  v[3] = _mm_sub_epi32(y, x);
  v[3] = _mm_add_epi32(v[3], rnding);
  v[3] = _mm_srai_epi32(v[3], bit);

  y = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  v[6] = _mm_add_epi32(y, x);
  v[6] = _mm_add_epi32(v[6], rnding);
  v[6] = _mm_srai_epi32(v[6], bit);

  v[7] = _mm_sub_epi32(y, x);
  v[7] = _mm_add_epi32(v[7], rnding);
  v[7] = _mm_srai_epi32(v[7], bit);

  y = _mm_mullo_epi32(v[10], cospi32);
  x = _mm_mullo_epi32(v[11], cospi32);
  v[10] = _mm_add_epi32(y, x);
  v[10] = _mm_add_epi32(v[10], rnding);
  v[10] = _mm_srai_epi32(v[10], bit);

  v[11] = _mm_sub_epi32(y, x);
  v[11] = _mm_add_epi32(v[11], rnding);
  v[11] = _mm_srai_epi32(v[11], bit);

  y = _mm_mullo_epi32(v[14], cospi32);
  x = _mm_mullo_epi32(v[15], cospi32);
  v[14] = _mm_add_epi32(y, x);
  v[14] = _mm_add_epi32(v[14], rnding);
  v[14] = _mm_srai_epi32(v[14], bit);

  v[15] = _mm_sub_epi32(y, x);
  v[15] = _mm_add_epi32(v[15], rnding);
  v[15] = _mm_srai_epi32(v[15], bit);

  // stage 9
  if (do_cols) {
    out[0] = v[0];
    out[1] = _mm_sub_epi32(zero, v[8]);
    out[2] = v[12];
    out[3] = _mm_sub_epi32(zero, v[4]);
    out[4] = v[6];
    out[5] = _mm_sub_epi32(zero, v[14]);
    out[6] = v[10];
    out[7] = _mm_sub_epi32(zero, v[2]);
    out[8] = v[3];
    out[9] = _mm_sub_epi32(zero, v[11]);
    out[10] = v[15];
    out[11] = _mm_sub_epi32(zero, v[7]);
    out[12] = v[5];
    out[13] = _mm_sub_epi32(zero, v[13]);
    out[14] = v[9];
    out[15] = _mm_sub_epi32(zero, v[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(v[0], v[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(v[12], v[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[6], v[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[10], v[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[3], v[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[15], v[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[5], v[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[9], v[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}